

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringBuffer.cc
# Opt level: O1

void __thiscall Vector::storeValue(Vector *this,long v,unsigned_long l)

{
  ulong uVar1;
  long *plVar2;
  long lVar3;
  
  uVar1 = this->vaLength;
  if (uVar1 <= l) {
    lVar3 = (l + 1) - uVar1;
    if (lVar3 < vDefaultBoost) {
      lVar3 = vDefaultBoost;
    }
    this->vaLength = lVar3 + uVar1;
    plVar2 = (long *)realloc(this->vData,(lVar3 + uVar1) * 8);
    this->vData = plVar2;
    this->vLength = l + 1;
  }
  this->vData[l] = v;
  return;
}

Assistant:

void Vector::storeValue(const long v, const unsigned long l) {
  long addThis;
  if (l >= vaLength) {
    addThis = l - vaLength + 1;
    if (Vector::vDefaultBoost > addThis)
      addThis = Vector::vDefaultBoost;
    vaLength += addThis;
    vData = (long *)realloc(vData, sizeof(long) * vaLength);
    vLength = l + 1;
  }
  vData[l] = v;
}